

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typed-message.h
# Opt level: O1

bool rtosc::validate<0,int,float,float>(char *arg)

{
  char cVar1;
  bool bVar2;
  
  cVar1 = rtosc_type(arg,0);
  if (cVar1 == 'i') {
    bVar2 = validate<1,float,float>(arg);
    return bVar2;
  }
  return false;
}

Assistant:

bool validate(const char *arg)
{
    advance_size<This> size;
    if(size && !valid_char<This>(rtosc_type(arg,i)))
        return false;
    else if(!size && !match_path<This>(size, arg))
        return false;
    else
        return validate<i+size.value,Rest...>(arg);
}